

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_dart_struct_reader(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pcVar2;
  t_field *tfield;
  t_dart_generator *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  size_type sVar8;
  pointer pptVar9;
  char *this_01;
  string field_name;
  string local_288;
  t_dart_generator *local_268;
  t_struct *local_260;
  ostream *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_260 = tstruct;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"read(TProtocol iprot)",0x15);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TField field;",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readStructBegin();",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"while (true)",0xc);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
  scope_up(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"field = iprot.readFieldBegin();",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (field.type == TType.STOP)",0x1d);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
  scope_up(this,out,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"break;",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"switch (field.id)",0x11);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
  scope_up(this,out,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pptVar9 = (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_268 = this;
  local_258 = out;
  if (pptVar9 !=
      (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"case ",5);
      pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
      local_250 = &local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
      sVar4 = local_248;
      paVar3 = local_250;
      if (local_248 != 0) {
        sVar8 = 0;
        do {
          iVar6 = toupper((int)paVar3->_M_local_buf[sVar8]);
          paVar3->_M_local_buf[sVar8] = (char)iVar6;
          sVar8 = sVar8 + 1;
        } while (sVar4 != sVar8);
      }
      sVar4 = local_248;
      this = local_268;
      if (local_250 == &local_240) {
        local_288.field_2._8_8_ = local_240._8_8_;
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288._M_dataplus._M_p = (pointer)local_250;
      }
      local_288.field_2._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
      local_288.field_2._M_local_buf[0] = local_240._M_local_buf[0];
      local_288._M_string_length = local_248;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_250 = &local_240;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      out = local_258;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar7 = t_generator::indent((t_generator *)this,out);
      this_01 = "if (field.type == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (field.type == ",0x12);
      type_to_enum_abi_cxx11_(&local_288,(t_dart_generator *)this_01,(*pptVar9)->type_);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," ","");
      scope_up(this,out,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      tfield = *pptVar9;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"this.","");
      generate_deserialize_field(this,out,tfield,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      generate_isset_set(this,out,*pptVar9);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190," else","");
      scope_down(this,out,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0," ","");
      scope_up(this,out,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"TProtocolUtil.skip(iprot, field.type);",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
      scope_down(this,out,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"break;",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"TProtocolUtil.skip(iprot, field.type);",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"break;",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readFieldEnd();",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readStructEnd();",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "// check for required fields of primitive type, which can\'t be checked in the validate method"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  this_00 = local_268;
  pptVar9 = (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*pptVar9)->req_ == T_REQUIRED) {
        bVar5 = type_can_be_null(this,(*pptVar9)->type_);
        if (!bVar5) {
          pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
          local_230 = &local_220;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
          paVar3 = local_230;
          iVar6 = tolower((int)local_230->_M_local_buf[0]);
          paVar3->_M_local_buf[0] = (char)iVar6;
          out = local_258;
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          if (local_230 == &local_220) {
            local_288.field_2._8_8_ = local_220._8_8_;
          }
          else {
            local_288._M_dataplus._M_p = (pointer)local_230;
          }
          local_288.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
          local_288.field_2._M_local_buf[0] = local_220._M_local_buf[0];
          local_288._M_string_length = local_228;
          local_228 = 0;
          local_220._M_local_buf[0] = '\0';
          local_230 = &local_220;
          poVar7 = t_generator::indent((t_generator *)this,local_258);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (!__isset_",0xd);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0," ","");
          scope_up(this_00,out,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          poVar7 = t_generator::indent((t_generator *)this_00,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'",
                     0x48);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\' was not found in serialized data! Struct: \" + toString());",0x3c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,endl2_abi_cxx11_._M_dataplus._M_p,
                     endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
          this = local_268;
          scope_down(local_268,out,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
        }
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"validate();",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "read(TProtocol iprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables and read struct header
  indent(out) << "TField field;" << endl;
  indent(out) << "iprot.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true)";
  scope_up(out);

  // Read beginning field marker
  indent(out) << "field = iprot.readFieldBegin();" << endl;

  // Check for field STOP marker and break
  indent(out) << "if (field.type == TType.STOP)";
  scope_up(out);
  indent(out) << "break;" << endl;
  scope_down(out);

  // Switch statement on the field we are reading
  indent(out) << "switch (field.id)";
  scope_up(out);

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << upcase_string((*f_iter)->get_name()) << ":" << endl;
    indent_up();

    indent(out) << "if (field.type == " << type_to_enum((*f_iter)->get_type()) << ")";
    scope_up(out);

    generate_deserialize_field(out, *f_iter, "this.");
    generate_isset_set(out, *f_iter);

    scope_down(out, " else");
    scope_up(out);
    indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
    scope_down(out);

    indent(out) << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  // Read field end marker
  indent(out) << "iprot.readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "iprot.readStructEnd();" << endl2;

  // in non-beans style, check for required fields of primitive type
  // (which can be checked here but not in the general validate method)
  indent(out) << "// check for required fields of primitive type, which can't be "
                 "checked in the validate method" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED && !type_can_be_null((*f_iter)->get_type())) {
      string field_name = get_member_name((*f_iter)->get_name());
      indent(out) << "if (!__isset_" << field_name << ")";
      scope_up(out);
      indent(out) << "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
          << field_name
          << "' was not found in serialized data! Struct: \" + toString());" << endl;
      scope_down(out, endl2);
    }
  }

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl;

  scope_down(out, endl2);
}